

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int64_t stdin_reader(exr_const_context_t file,void *userdata,void *buffer,uint64_t sz,
                    uint64_t offset,exr_stream_error_func_ptr_t error_cb)

{
  int64_t iVar1;
  
  if (stdin_reader::lastoffset == offset) {
    iVar1 = read(0,buffer,sz);
    if (0 < iVar1) {
      stdin_reader::lastoffset = iVar1 + offset;
    }
  }
  else {
    (*error_cb)(file,10,"Unable to seek in stdin stream");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int64_t
stdin_reader (
    exr_const_context_t         file,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    static uint64_t lastoffset = 0;
    int64_t         nread      = 0;

    (void) userdata;

    if (offset != lastoffset)
    {
        error_cb (file, EXR_ERR_READ_IO, "Unable to seek in stdin stream");
        return -1;
    }
#ifdef _WIN32
    if (sz >= (size_t) (INT32_MAX))
    {
        error_cb (
            file, EXR_ERR_READ_IO, "Read request too large for win32 API");
        return -1;
    }
    nread = _read (_fileno (stdin), buffer, (unsigned) sz);
#else
    nread = read (STDIN_FILENO, buffer, sz);
#endif
    if (nread > 0) lastoffset = offset + (uint64_t) nread;
    return nread;
}